

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O2

void __thiscall nuraft::timer_helper::set_duration_us(timer_helper *this,size_t us)

{
  std::mutex::lock(&this->lock_);
  this->duration_us_ = us;
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  return;
}

Assistant:

void set_duration_us(size_t us) {
        std::lock_guard<std::mutex> l(lock_);
        duration_us_ = us;
    }